

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

int Omega_h::get_min<int>(Read<int> *a)

{
  Alloc *pAVar1;
  int iVar2;
  ulong uVar3;
  type transform;
  Write<int> local_20;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  Write<int>::Write(&local_20,&a->write_);
  iVar2 = transform_reduce<Omega_h::IntIterator,Omega_h::get_min<int>(Omega_h::Read<int>)::_lambda(int)_1_,int,Omega_h::minimum<int>>
                    (0,uVar3 >> 2 & 0xffffffff,0x7fffffff,&local_20);
  Write<int>::~Write(&local_20);
  return iVar2;
}

Assistant:

T get_min(Read<T> a) {
  auto const first = IntIterator(0);
  auto const last = IntIterator(a.size());
  auto const init = promoted_t<T>(ArithTraits<T>::max());
  auto const op = minimum<promoted_t<T>>();
  auto transform = OMEGA_H_LAMBDA(LO i)->promoted_t<T> {
    return promoted_t<T>(a[i]);
  };
  auto const r = transform_reduce(first, last, init, op, std::move(transform));
  return T(r);  // see StandinTraits
}